

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageClose(Fts5Storage *p)

{
  sqlite3_stmt *in_RDI;
  int i;
  int rc;
  undefined4 local_10;
  
  if (in_RDI != (sqlite3_stmt *)0x0) {
    for (local_10 = 0; local_10 < 0xc; local_10 = local_10 + 1) {
      sqlite3_finalize(in_RDI);
    }
    sqlite3_free((void *)0x269edb);
  }
  return 0;
}

Assistant:

static int sqlite3Fts5StorageClose(Fts5Storage *p){
  int rc = SQLITE_OK;
  if( p ){
    int i;

    /* Finalize all SQL statements */
    for(i=0; i<ArraySize(p->aStmt); i++){
      sqlite3_finalize(p->aStmt[i]);
    }

    sqlite3_free(p);
  }
  return rc;
}